

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::r_formatter<spdlog::details::null_scoped_padder>::format
          (r_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  uint uVar1;
  int iVar2;
  byte bVar3;
  uint uVar4;
  size_t sVar5;
  undefined2 uVar6;
  ulong uVar7;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  args;
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  args_00;
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  args_01;
  ulong local_38 [2];
  
  uVar1 = tm_time->tm_hour;
  uVar4 = uVar1 - 0xc;
  if ((int)uVar1 < 0xd) {
    uVar4 = uVar1;
  }
  if (uVar4 < 100) {
    bVar3 = (byte)((uVar4 & 0xff) / 10);
    sVar5 = (dest->super_buffer<char>).size_;
    uVar7 = sVar5 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar7) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar5 = (dest->super_buffer<char>).size_;
      uVar7 = sVar5 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar7;
    (dest->super_buffer<char>).ptr_[sVar5] = bVar3 | 0x30;
    sVar5 = (dest->super_buffer<char>).size_;
    uVar7 = sVar5 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar7) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar5 = (dest->super_buffer<char>).size_;
      uVar7 = sVar5 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar7;
    (dest->super_buffer<char>).ptr_[sVar5] = (char)uVar4 + bVar3 * -10 | 0x30;
  }
  else {
    local_38[0] = (ulong)uVar4;
    format_str.size_ = 5;
    format_str.data_ = "{:02}";
    args.field_1.values_ =
         (value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
          *)local_38;
    args.types_ = 2;
    fmt::v6::
    vformat_to<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>>,char,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
              ((range)dest,format_str,args,(locale_ref)0x0);
  }
  sVar5 = (dest->super_buffer<char>).size_;
  uVar7 = sVar5 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar7) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    sVar5 = (dest->super_buffer<char>).size_;
    uVar7 = sVar5 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar7;
  (dest->super_buffer<char>).ptr_[sVar5] = ':';
  uVar1 = tm_time->tm_min;
  if ((ulong)uVar1 < 100) {
    bVar3 = (byte)((uVar1 & 0xff) / 10);
    sVar5 = (dest->super_buffer<char>).size_;
    uVar7 = sVar5 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar7) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar5 = (dest->super_buffer<char>).size_;
      uVar7 = sVar5 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar7;
    (dest->super_buffer<char>).ptr_[sVar5] = bVar3 | 0x30;
    sVar5 = (dest->super_buffer<char>).size_;
    uVar7 = sVar5 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar7) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar5 = (dest->super_buffer<char>).size_;
      uVar7 = sVar5 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar7;
    (dest->super_buffer<char>).ptr_[sVar5] = (char)uVar1 + bVar3 * -10 | 0x30;
  }
  else {
    format_str_00.size_ = 5;
    format_str_00.data_ = "{:02}";
    args_00.field_1.values_ =
         (value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
          *)local_38;
    args_00.types_ = 2;
    local_38[0] = (ulong)uVar1;
    fmt::v6::
    vformat_to<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>>,char,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
              ((range)dest,format_str_00,args_00,(locale_ref)0x0);
  }
  sVar5 = (dest->super_buffer<char>).size_;
  uVar7 = sVar5 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar7) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    sVar5 = (dest->super_buffer<char>).size_;
    uVar7 = sVar5 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar7;
  (dest->super_buffer<char>).ptr_[sVar5] = ':';
  uVar1 = tm_time->tm_sec;
  if ((ulong)uVar1 < 100) {
    bVar3 = (byte)((uVar1 & 0xff) / 10);
    sVar5 = (dest->super_buffer<char>).size_;
    uVar7 = sVar5 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar7) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar5 = (dest->super_buffer<char>).size_;
      uVar7 = sVar5 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar7;
    (dest->super_buffer<char>).ptr_[sVar5] = bVar3 | 0x30;
    sVar5 = (dest->super_buffer<char>).size_;
    uVar7 = sVar5 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar7) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar5 = (dest->super_buffer<char>).size_;
      uVar7 = sVar5 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar7;
    (dest->super_buffer<char>).ptr_[sVar5] = (char)uVar1 + bVar3 * -10 | 0x30;
  }
  else {
    format_str_01.size_ = 5;
    format_str_01.data_ = "{:02}";
    args_01.field_1.values_ =
         (value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
          *)local_38;
    args_01.types_ = 2;
    local_38[0] = (ulong)uVar1;
    fmt::v6::
    vformat_to<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>>,char,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
              ((range)dest,format_str_01,args_01,(locale_ref)0x0);
  }
  sVar5 = (dest->super_buffer<char>).size_;
  uVar7 = sVar5 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar7) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    sVar5 = (dest->super_buffer<char>).size_;
    uVar7 = sVar5 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar7;
  (dest->super_buffer<char>).ptr_[sVar5] = ' ';
  iVar2 = tm_time->tm_hour;
  sVar5 = (dest->super_buffer<char>).size_;
  uVar7 = sVar5 + 2;
  if ((dest->super_buffer<char>).capacity_ < uVar7) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar7);
    sVar5 = (dest->super_buffer<char>).size_;
  }
  uVar6 = 0x4d41;
  if (0xb < iVar2) {
    uVar6 = 0x4d50;
  }
  *(undefined2 *)((dest->super_buffer<char>).ptr_ + sVar5) = uVar6;
  (dest->super_buffer<char>).size_ = uVar7;
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 11;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::pad2(to12h(tm_time), dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_sec, dest);
        dest.push_back(' ');
        fmt_helper::append_string_view(ampm(tm_time), dest);
    }